

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

Node * __thiscall wasm::DataFlow::Graph::doVisitUnary(Graph *this,Unary *curr)

{
  bool bVar1;
  Graph *this_00;
  Node *pNVar2;
  Node *value_1;
  Node *ret;
  Node *value;
  Unary *curr_local;
  Graph *this_local;
  
  if (curr->op < NegFloat32) {
    pNVar2 = Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                       ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,curr->value);
    this_local = (Graph *)expandFromI1(this,pNVar2,(Expression *)curr);
    bVar1 = Node::isBad((Node *)this_local);
    if (!bVar1) {
      pNVar2 = Node::makeExpr((Expression *)curr,(Expression *)curr);
      this_00 = (Graph *)addNode(this,pNVar2);
      Node::addValue((Node *)this_00,(Node *)this_local);
      this_local = this_00;
    }
  }
  else if (curr->op - EqZInt32 < 2) {
    pNVar2 = Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                       ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,curr->value);
    this_local = (Graph *)expandFromI1(this,pNVar2,(Expression *)curr);
    bVar1 = Node::isBad((Node *)this_local);
    if (!bVar1) {
      this_local = (Graph *)makeZeroComp(this,(Node *)this_local,true,(Expression *)curr);
    }
  }
  else {
    this_local = (Graph *)makeVar(this,(Type)(curr->
                                             super_SpecificExpression<(wasm::Expression::Id)15>).
                                             super_Expression.type.id);
  }
  return &this_local->bad;
}

Assistant:

Node* doVisitUnary(Unary* curr) {
    // First, check if we support this op.
    switch (curr->op) {
      case ClzInt32:
      case ClzInt64:
      case CtzInt32:
      case CtzInt64:
      case PopcntInt32:
      case PopcntInt64: {
        // These are ok as-is.
        // Check if our child is supported.
        auto* value = expandFromI1(visit(curr->value), curr);
        if (value->isBad()) {
          return value;
        }
        // Great, we are supported!
        auto* ret = addNode(Node::makeExpr(curr, curr));
        ret->addValue(value);
        return ret;
      }
      case EqZInt32:
      case EqZInt64: {
        // These can be implemented using a binary.
        // Check if our child is supported.
        auto* value = expandFromI1(visit(curr->value), curr);
        if (value->isBad()) {
          return value;
        }
        // Great, we are supported!
        return makeZeroComp(value, true, curr);
      }
      default: {
        // Anything else is an unknown value.
        return makeVar(curr->type);
      }
    }
  }